

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O3

void __thiscall
arma::Mat<double>::
Mat<arma::Mat<double>,arma::Glue<arma::Mat<double>,arma::eGlue<arma::Op<arma::Col<double>,arma::op_repmat>,arma::Mat<double>,arma::eglue_minus>,arma::glue_times>,arma::eglue_plus>
          (Mat<double> *this,
          eGlue<arma::Mat<double>,_arma::Glue<arma::Mat<double>,_arma::eGlue<arma::Op<arma::Col<double>,_arma::op_repmat>,_arma::Mat<double>,_arma::eglue_minus>,_arma::glue_times>,_arma::eglue_plus>
          *X)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mat<double> *pMVar4;
  double *pdVar5;
  double *pdVar6;
  char *in_RAX;
  eT *out_mem;
  double *pdVar7;
  uword uVar8;
  ulong uVar9;
  ea_type P1;
  char (*x) [39];
  ulong uVar10;
  char *local_18;
  
  x = (char (*) [39])&local_18;
  pMVar4 = (X->P1).Q;
  uVar1 = pMVar4->n_rows;
  this->n_rows = uVar1;
  uVar2 = pMVar4->n_cols;
  this->n_cols = uVar2;
  uVar3 = pMVar4->n_elem;
  this->n_elem = uVar3;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  if ((0xffff < uVar2 || 0xffff < uVar1) && (4294967295.0 < (double)uVar2 * (double)uVar1)) {
    local_18 = "Mat::init(): requested size is too large; suggest to enable ARMA_64BIT_WORD";
    arma_stop_logic_error<char_const*>
              ((arma *)&local_18,(char **)CONCAT71(0x100,0xffff < uVar2 || 0xffff < uVar1));
LAB_0014af26:
    arma_stop_bad_alloc<char[39]>(x);
  }
  if (uVar3 < 0x11) {
    pdVar7 = this->mem_local;
    if ((ulong)uVar3 == 0) {
      pdVar7 = (double *)0x0;
    }
    this->mem = pdVar7;
    uVar8 = 0;
  }
  else {
    x = (char (*) [39])((ulong)uVar3 << 3);
    local_18 = in_RAX;
    pdVar7 = (double *)lkalloc::malloc((size_t)x);
    if (pdVar7 == (double *)0x0) goto LAB_0014af26;
    this->mem = pdVar7;
    uVar8 = this->n_elem;
  }
  this->n_alloc = uVar8;
  pMVar4 = (X->P1).Q;
  uVar9 = (ulong)pMVar4->n_elem;
  if (((ulong)pdVar7 & 0xf) == 0) {
    pdVar5 = pMVar4->mem;
    pdVar6 = (X->P2).Q.mem;
    if ((((uint)pdVar6 | (uint)pdVar5) & 0xf) == 0) {
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          pdVar7[uVar10] = pdVar5[uVar10] + pdVar6[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    else if (uVar9 != 0) {
      uVar10 = 0;
      do {
        pdVar7[uVar10] = pdVar5[uVar10] + pdVar6[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  else if (uVar9 != 0) {
    pdVar5 = pMVar4->mem;
    pdVar6 = (X->P2).Q.mem;
    uVar10 = 0;
    do {
      pdVar7[uVar10] = pdVar5[uVar10] + pdVar6[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eGlue<T1, T2, eglue_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  arma_type_check(( is_same_type< eT, typename T2::elem_type >::no ));
  
  init_cold();
  
  eglue_type::apply(*this, X);
  }